

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::FileClassName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  FileDescriptor *file_00;
  allocator<char> local_c9;
  string local_c8;
  string local_98;
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  string name;
  FileDescriptor *file_local;
  
  name.field_2._8_8_ = this;
  FileClassPrefix_abi_cxx11_((string *)local_38,this,file);
  BaseFileName_abi_cxx11_(&local_98,(objectivec *)name.field_2._8_8_,file_00);
  StripProto(&local_78,&local_98);
  anon_unknown_0::UnderscoresToCamelCase(&local_58,&local_78,true);
  std::__cxx11::string::operator+=((string *)local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::operator+=((string *)local_38,"Root");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"_RootClass",&local_c9);
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,(string *)local_38,&local_c8,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string FileClassName(const FileDescriptor* file) {
  string name = FileClassPrefix(file);
  name += UnderscoresToCamelCase(StripProto(BaseFileName(file)), true);
  name += "Root";
  // There aren't really any reserved words that end in "Root", but playing
  // it safe and checking.
  return SanitizeNameForObjC(name, "_RootClass", NULL);
}